

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void google::protobuf::TextFormat::PrintFieldValueToString
               (Message *message,FieldDescriptor *field,int index,string *output)

{
  Printer local_b0;
  
  Printer::Printer(&local_b0);
  Printer::PrintFieldValueToString(&local_b0,message,field,index,output);
  Printer::~Printer(&local_b0);
  return;
}

Assistant:

void TextFormat::PrintFieldValueToString(
    const Message& message, const FieldDescriptor* field, int index,
    std::string* output) {
  return Printer().PrintFieldValueToString(message, field, index, output);
}